

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlUTF8Size(xmlChar *utf)

{
  int local_20;
  byte local_19;
  int len;
  xmlChar mask;
  xmlChar *utf_local;
  
  if (utf == (xmlChar *)0x0) {
    utf_local._4_4_ = -1;
  }
  else if (*utf < 0x80) {
    utf_local._4_4_ = 1;
  }
  else if ((*utf & 0x40) == 0) {
    utf_local._4_4_ = -1;
  }
  else {
    local_20 = 2;
    for (local_19 = 0x20; local_19 != 0; local_19 = (byte)((int)(uint)local_19 >> 1)) {
      if ((*utf & local_19) == 0) {
        return local_20;
      }
      local_20 = local_20 + 1;
    }
    utf_local._4_4_ = -1;
  }
  return utf_local._4_4_;
}

Assistant:

int
xmlUTF8Size(const xmlChar *utf) {
    xmlChar mask;
    int len;

    if (utf == NULL)
        return -1;
    if (*utf < 0x80)
        return 1;
    /* check valid UTF8 character */
    if (!(*utf & 0x40))
        return -1;
    /* determine number of bytes in char */
    len = 2;
    for (mask=0x20; mask != 0; mask>>=1) {
        if (!(*utf & mask))
            return len;
        len++;
    }
    return -1;
}